

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathIdFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr pxVar1;
  xmlNodeSetPtr val;
  xmlChar *pxVar2;
  xmlNodeSetPtr pxVar3;
  long lVar4;
  int iStack_40;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      iStack_40 = 0x17;
    }
    else {
      pxVar1 = xmlXPathValuePop(ctxt);
      if (pxVar1 != (xmlXPathObjectPtr)0x0) {
        if ((pxVar1->type | XPATH_USERS) == XPATH_XSLT_TREE) {
          val = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
          if (val == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          else {
            val->nodeNr = 0;
            val->nodeMax = 0;
            val->nodeTab = (xmlNodePtr *)0x0;
          }
          pxVar3 = pxVar1->nodesetval;
          if (pxVar3 != (xmlNodeSetPtr)0x0) {
            for (lVar4 = 0; lVar4 < pxVar3->nodeNr; lVar4 = lVar4 + 1) {
              pxVar2 = xmlNodeGetContent(pxVar3->nodeTab[lVar4]);
              if (pxVar2 == (xmlChar *)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              pxVar3 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar2);
              if (pxVar3 == (xmlNodeSetPtr)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              val = xmlXPathNodeSetMerge(val,pxVar3);
              if (val == (xmlNodeSetPtr)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              xmlXPathFreeNodeSet(pxVar3);
              if (pxVar2 != (xmlChar *)0x0) {
                (*xmlFree)(pxVar2);
              }
              pxVar3 = pxVar1->nodesetval;
            }
          }
          xmlXPathReleaseObject(ctxt->context,pxVar1);
        }
        else {
          pxVar2 = xmlXPathCastToString(pxVar1);
          if (pxVar2 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar1);
          val = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar2);
          if (val == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          (*xmlFree)(pxVar2);
        }
        pxVar1 = xmlXPathCacheWrapNodeSet(ctxt,val);
        xmlXPathValuePush(ctxt,pxVar1);
        return;
      }
      iStack_40 = 10;
    }
  }
  else {
    iStack_40 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_40);
  return;
}

Assistant:

void
xmlXPathIdFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *tokens;
    xmlNodeSetPtr ret;
    xmlXPathObjectPtr obj;

    CHECK_ARITY(1);
    obj = xmlXPathValuePop(ctxt);
    if (obj == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
	xmlNodeSetPtr ns;
	int i;

	ret = xmlXPathNodeSetCreate(NULL);
        if (ret == NULL)
            xmlXPathPErrMemory(ctxt);

	if (obj->nodesetval != NULL) {
	    for (i = 0; i < obj->nodesetval->nodeNr; i++) {
		tokens =
		    xmlXPathCastNodeToString(obj->nodesetval->nodeTab[i]);
                if (tokens == NULL)
                    xmlXPathPErrMemory(ctxt);
		ns = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
                if (ns == NULL)
                    xmlXPathPErrMemory(ctxt);
		ret = xmlXPathNodeSetMerge(ret, ns);
                if (ret == NULL)
                    xmlXPathPErrMemory(ctxt);
		xmlXPathFreeNodeSet(ns);
		if (tokens != NULL)
		    xmlFree(tokens);
	    }
	}
	xmlXPathReleaseObject(ctxt->context, obj);
	xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, ret));
	return;
    }
    tokens = xmlXPathCastToString(obj);
    if (tokens == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlXPathReleaseObject(ctxt->context, obj);
    ret = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlFree(tokens);
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, ret));
}